

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Matchers::StdString::CasedString::adjustString
          (string *__return_storage_ptr__,CasedString *this,string *str)

{
  pointer pcVar1;
  
  if (this->m_caseSensitivity == No) {
    toLower(__return_storage_ptr__,str);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (str->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CasedString::adjustString(std::string const& str) const {
                return m_caseSensitivity == CaseSensitive::No
                    ? toLower(str)
                    : str;
            }